

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.cpp
# Opt level: O1

IVec4 __thiscall tcu::RGBA::toIVec(RGBA *this)

{
  uint uVar1;
  uint *in_RSI;
  IVec4 IVar2;
  
  uVar1 = *in_RSI;
  this->m_value = uVar1 & 0xff;
  this[1].m_value = uVar1 >> 8 & 0xff;
  this[2].m_value = uVar1 >> 0x10 & 0xff;
  this[3].m_value = uVar1 >> 0x18;
  IVar2.m_data[2] = 0xff;
  IVar2.m_data[3] = 0;
  IVar2.m_data._0_8_ = this;
  return (IVec4)IVar2.m_data;
}

Assistant:

IVec4 RGBA::toIVec (void) const
{
	return IVec4(getRed(), getGreen(), getBlue(), getAlpha());
}